

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O2

int pr_psupp(part_t *part,int mode)

{
  int in_ECX;
  char *data;
  int in_R8D;
  long lVar1;
  bool bVar2;
  
  if (pr_psupp::ps_fp == (FILE *)0x0) {
    pr_psupp::ps_fp = print_prep(1,mode);
  }
  data = part->s[0].comment;
  lVar1 = 4;
  while (bVar2 = lVar1 != 0, lVar1 = lVar1 + -1, bVar2) {
    dbg_print(3,pr_psupp::ps_fp,(partsupp_t *)(data + -0x20),in_ECX,in_R8D);
    dbg_print(3,pr_psupp::ps_fp,data + -0x18,in_ECX,in_R8D);
    dbg_print(3,pr_psupp::ps_fp,data + -0x10,in_ECX,in_R8D);
    dbg_print(5,pr_psupp::ps_fp,data + -8,in_ECX,in_R8D);
    dbg_print(0,pr_psupp::ps_fp,data,in_ECX,in_R8D);
    fputc(10,(FILE *)pr_psupp::ps_fp);
    data = data + 0xf0;
  }
  return 0;
}

Assistant:

int
pr_psupp(part_t *part, int mode)
{
    static FILE *ps_fp = NULL;
    long      i;

    if (ps_fp == NULL)
        ps_fp = print_prep(PSUPP, mode);

   for (i = 0; i < SUPP_PER_PART; i++)
      {
      PR_STRT(ps_fp);
      PR_HUGE(ps_fp, &part->s[i].partkey);
      PR_HUGE(ps_fp, &part->s[i].suppkey);
      PR_HUGE(ps_fp, &part->s[i].qty);
      PR_MONEY(ps_fp, &part->s[i].scost);
      PR_VSTR_LAST(ps_fp, part->s[i].comment,part->s[i].clen);
      PR_END(ps_fp);
      }

   return(0);
}